

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv+scc.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  int extraout_EAX;
  FILE *flv;
  utf8_char_t *data;
  FILE *flv_00;
  size_t sVar3;
  uint uVar4;
  char **ppcVar5;
  utf8_char_t *data_00;
  scc_t *scc;
  int has_video;
  int has_audio;
  flvtag_t tag;
  size_t scc_size;
  scc_t *local_58;
  int local_50;
  int local_4c;
  flvtag_t local_48;
  size_t local_38;
  
  local_58 = (scc_t *)0x0;
  local_38 = 0;
  if (argc < 4) {
    main_cold_5();
LAB_00104b79:
    main_cold_4();
  }
  else {
    flv = flv_open_read(argv[1]);
    data = utf8_load_text_file(argv[2],&local_38);
    flv_00 = flv_open_write(argv[3]);
    if (flv == (FILE *)0x0) goto LAB_00104b79;
    if (data != (utf8_char_t *)0x0) {
      if (flv_00 != (FILE *)0x0) {
        flvtag_init(&local_48);
        iVar2 = flv_read_header(flv,&local_4c,&local_50);
        if (iVar2 == 0) {
          main_cold_1();
          iVar2 = 1;
        }
        else {
          flv_write_header(flv_00,local_4c,local_50);
          sVar3 = scc_to_608(&local_58,data);
          iVar2 = flv_read_tag(flv,&local_48);
          if (iVar2 != 0) {
            data_00 = data + sVar3;
            do {
              uVar4 = 0;
              if ((((*local_48.data & 0x1f) == 9) && (uVar4 = 0, (local_48.data[0xb] & 0xf) == 7))
                 && (local_48.data[0xc] == 1)) {
                uVar4 = (uint)local_48.data[0xf] |
                        (uint)local_48.data[0xe] << 8 | (uint)local_48.data[0xd] << 0x10;
              }
              dVar1 = (double)(((uint)local_48.data[5] << 8 |
                                (uint)local_48.data[7] << 0x18 | (uint)local_48.data[4] << 0x10 |
                               (uint)local_48.data[6]) + uVar4) / 1000.0;
              if ((((local_58 != (scc_t *)0x0) && (local_58->cc_size != 0)) &&
                  (((*local_48.data & 0x1f) == 9 &&
                   ((local_58->timestamp <= dVar1 && dVar1 != local_58->timestamp &&
                    ((local_48.data[0xb] & 0xf) == 7)))))) && (local_48.data[0xc] == 1)) {
                flvtag_addcaption_scc(&local_48,local_58);
                sVar3 = scc_to_608(&local_58,data_00);
                data_00 = data_00 + sVar3;
              }
              flv_write_tag(flv_00,&local_48);
              iVar2 = flv_read_tag(flv,&local_48);
            } while (iVar2 != 0);
          }
          free(data);
          flvtag_free(&local_48);
          iVar2 = 0;
        }
        return iVar2;
      }
      goto LAB_00104b8d;
    }
  }
  argv = argv + 2;
  main_cold_3();
LAB_00104b8d:
  ppcVar5 = argv + 3;
  main_cold_2();
  *ppcVar5 = (char *)0x0;
  ppcVar5[1] = (char *)0x0;
  return extraout_EAX;
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    scc_t* scc = NULL;
    size_t scc_size = 0;

    if (4 > argc) {
        fprintf(stderr, "Usage: %s input.flv input.scc output.flv\nuse '-' for stdin or stdout\n", argv[0]);
        exit(EXIT_FAILURE);
    }

    FILE* flv = flv_open_read(argv[1]);
    utf8_char_t* scc_data_ptr = utf8_load_text_file(argv[2], &scc_size);
    utf8_char_t* scc_data = scc_data_ptr;
    FILE* out = flv_open_write(argv[3]);

    if (!flv) {
        fprintf(stderr, "Falule to open input flv '%s'\n", argv[1]);
        exit(EXIT_FAILURE);
    }

    if (!scc_data) {
        fprintf(stderr, "Falule to open input scc '%s'\n", argv[2]);
        exit(EXIT_FAILURE);
    }

    if (!out) {
        fprintf(stderr, "Falule to open output flv '%s'\n", argv[3]);
        exit(EXIT_FAILURE);
    }

    int has_audio, has_video;
    flvtag_init(&tag);

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "%s is not an flv file\n", argv[1]);
        return EXIT_FAILURE;
    }

    flv_write_header(out, has_audio, has_video);

    // read the first scc
    scc_data += scc_to_608(&scc, scc_data);

    while (flv_read_tag(flv, &tag)) {
        double timestamp = flvtag_pts_seconds(&tag);

        if (scc && scc->cc_size && scc->timestamp < timestamp && flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            flvtag_addcaption_scc(&tag, scc);
            scc_data += scc_to_608(&scc, scc_data);
        }

        flv_write_tag(out, &tag);
    }

    free(scc_data_ptr);
    flvtag_free(&tag);
    return EXIT_SUCCESS;
}